

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError BuildDeviceList(PaAlsaHostApiRepresentation *alsaApi)

{
  PaAlsaHostApiRepresentation *pPVar1;
  PaUtilAllocationGroup *pPVar2;
  undefined8 uVar3;
  char *pcVar4;
  byte *pbVar5;
  HwDevInfo *__ptr;
  int iVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  byte *pbVar12;
  char *pcVar13;
  snd_config_t *psVar14;
  snd_config_t *psVar15;
  snd_config_t *psVar16;
  undefined8 uVar17;
  HwDevInfo *pHVar18;
  PaDeviceInfo **ppPVar19;
  PaAlsaDeviceInfo *devInfo;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong uVar20;
  PaError PVar21;
  PaAlsaDeviceInfo *devInfo_00;
  char *pcVar22;
  char *pcVar23;
  byte bVar24;
  byte *pbVar25;
  byte *pbVar26;
  byte bVar27;
  byte bVar28;
  long lVar29;
  char *pcVar30;
  char acStack_130 [16];
  char alsaCardName [50];
  char *local_e8;
  char buf [50];
  char *local_a8;
  char *alsaDeviceName;
  char *local_98;
  undefined8 local_90;
  snd_config_t *topNode;
  int local_80;
  uint local_7c;
  char *local_78;
  char *local_70;
  uint local_64;
  PaAlsaHostApiRepresentation *local_60;
  byte *local_58;
  char *cardName;
  undefined8 local_48;
  snd_ctl_t *ctl;
  int devIdx;
  int devIdx_1;
  
  ctl._0_4_ = 0;
  local_90 = 0;
  acStack_130[0] = -0x67;
  acStack_130[1] = -0x1f;
  acStack_130[2] = '\x10';
  acStack_130[3] = '\0';
  acStack_130[4] = '\0';
  acStack_130[5] = '\0';
  acStack_130[6] = '\0';
  acStack_130[7] = '\0';
  pcVar9 = getenv("PA_ALSA_INITIALIZE_BLOCK");
  if (pcVar9 == (char *)0x0) {
    local_64 = 1;
  }
  else {
    acStack_130[0] = -0x5a;
    acStack_130[1] = -0x1f;
    acStack_130[2] = '\x10';
    acStack_130[3] = '\0';
    acStack_130[4] = '\0';
    acStack_130[5] = '\0';
    acStack_130[6] = '\0';
    acStack_130[7] = '\0';
    iVar6 = atoi(pcVar9);
    local_64 = (uint)(iVar6 == 0);
  }
  acStack_130[0] = -0x3b;
  acStack_130[1] = -0x1f;
  acStack_130[2] = '\x10';
  acStack_130[3] = '\0';
  acStack_130[4] = '\0';
  acStack_130[5] = '\0';
  acStack_130[6] = '\0';
  acStack_130[7] = '\0';
  pcVar9 = getenv("PA_ALSA_PLUGHW");
  if (pcVar9 == (char *)0x0) {
    local_7c = 0;
    local_70 = "";
  }
  else {
    acStack_130[0] = -0x2e;
    acStack_130[1] = -0x1f;
    acStack_130[2] = '\x10';
    acStack_130[3] = '\0';
    acStack_130[4] = '\0';
    acStack_130[5] = '\0';
    acStack_130[6] = '\0';
    acStack_130[7] = '\0';
    iVar6 = atoi(pcVar9);
    local_7c = (uint)(iVar6 != 0);
    local_70 = "";
    if (iVar6 != 0) {
      local_70 = "plug";
    }
  }
  (alsaApi->baseHostApiRep).info.defaultInputDevice = -1;
  (alsaApi->baseHostApiRep).info.defaultOutputDevice = -1;
  local_80 = -1;
  acStack_130[0] = '\x1d';
  acStack_130[1] = -0x1e;
  acStack_130[2] = '\x10';
  acStack_130[3] = '\0';
  acStack_130[4] = '\0';
  acStack_130[5] = '\0';
  acStack_130[6] = '\0';
  acStack_130[7] = '\0';
  sVar10 = snd_ctl_card_info_sizeof();
  lVar29 = -(sVar10 + 0xf & 0xfffffffffffffff0);
  pcVar9 = acStack_130 + lVar29 + 8;
  _devIdx = (HwDevInfo *)0x0;
  pcVar22 = acStack_130 + lVar29;
  local_98 = pcVar9;
  pcVar22[0] = 'G';
  pcVar22[1] = -0x1e;
  pcVar22[2] = '\x10';
  pcVar22[3] = '\0';
  pcVar22[4] = '\0';
  pcVar22[5] = '\0';
  pcVar22[6] = '\0';
  pcVar22[7] = '\0';
  memset(pcVar9,0,sVar10);
  pcVar23 = acStack_130 + lVar29;
  pcVar23[0] = 'L';
  pcVar23[1] = -0x1e;
  pcVar23[2] = '\x10';
  pcVar23[3] = '\0';
  pcVar23[4] = '\0';
  pcVar23[5] = '\0';
  pcVar23[6] = '\0';
  pcVar23[7] = '\0';
  sVar10 = snd_pcm_info_sizeof();
  pcVar9 = pcVar9 + -(sVar10 + 0xf & 0xfffffffffffffff0);
  pcVar9[-8] = 'j';
  pcVar9[-7] = -0x1e;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  memset(pcVar9,0,sVar10);
  pcVar9[-8] = 'r';
  pcVar9[-7] = -0x1e;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  iVar6 = snd_card_next(&local_80);
  local_60 = alsaApi;
  if (local_80 < 0 || iVar6 != 0) {
    local_78 = (char *)0x1;
    pcVar30 = (char *)0x0;
  }
  else {
    local_78 = (char *)0x1;
    pcVar30 = (char *)0x0;
    _devIdx = (HwDevInfo *)0x0;
    pcVar13 = pcVar9;
    alsaDeviceName = pcVar9;
    do {
      ctl._4_4_ = -1;
      pcVar9[-8] = -0x34;
      pcVar9[-7] = -0x1e;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      snprintf(acStack_130 + 8,0x32,"hw:%d");
      pcVar9[-8] = -0x26;
      pcVar9[-7] = -0x1e;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      iVar6 = snd_ctl_open(&local_48,acStack_130 + 8,0);
      uVar3 = local_48;
      pcVar11 = local_98;
      if (-1 < iVar6) {
        pcVar9[-8] = -0xb;
        pcVar9[-7] = -0x1e;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        snd_ctl_card_info(uVar3,pcVar11);
        pcVar9[-8] = -3;
        pcVar9[-7] = -0x1e;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        pcVar11 = (char *)snd_ctl_card_info_get_name(pcVar11);
        pPVar1 = (PaAlsaHostApiRepresentation *)alsaApi->allocations;
        pcVar9[-8] = '\x10';
        pcVar9[-7] = -0x1d;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        paUtilErr_ = PaAlsa_StrDup(pPVar1,(char **)&local_58,pcVar11);
        uVar3 = local_48;
        if (paUtilErr_ < 0) {
          pcVar30 = 
          "Expression \'PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo ))\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1291\n"
          ;
LAB_0010e9d2:
          pcVar9[-8] = -0x27;
          pcVar9[-7] = -0x17;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          PaUtil_DebugPrint(pcVar30);
          return paUtilErr_;
        }
        pcVar9[-8] = '+';
        pcVar9[-7] = -0x1d;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        iVar6 = snd_ctl_pcm_next_device(uVar3,(long)&ctl + 4);
        pcVar11 = pcVar30;
        if (-1 < ctl._4_4_ && iVar6 == 0) {
          do {
            pcVar30 = local_70;
            pcVar9[-8] = 'm';
            pcVar9[-7] = -0x1d;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            snprintf((char *)&local_e8,0x32,"%s%s,%d",pcVar30,acStack_130 + 8);
            iVar6 = ctl._4_4_;
            pcVar9[-8] = 'x';
            pcVar9[-7] = -0x1d;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            snd_pcm_info_set_device(pcVar13,iVar6);
            pcVar9[-8] = -0x7e;
            pcVar9[-7] = -0x1d;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            snd_pcm_info_set_subdevice(pcVar13,0);
            pcVar9[-8] = -0x71;
            pcVar9[-7] = -0x1d;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            snd_pcm_info_set_stream(pcVar13,1);
            uVar3 = local_48;
            pcVar9[-8] = -0x65;
            pcVar9[-7] = -0x1d;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            uVar7 = snd_ctl_pcm_info(uVar3,pcVar13);
            pcVar9[-8] = -0x58;
            pcVar9[-7] = -0x1d;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            snd_pcm_info_set_stream(pcVar13,0);
            uVar3 = local_48;
            pcVar9[-8] = -0x4c;
            pcVar9[-7] = -0x1d;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            uVar8 = snd_ctl_pcm_info(uVar3,pcVar13);
            pcVar30 = pcVar11;
            if (-1 < (int)(uVar8 & uVar7)) {
              cardName = (char *)CONCAT44(cardName._4_4_,uVar8);
              pcVar9[-8] = -0x38;
              pcVar9[-7] = -0x1d;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              pbVar12 = (byte *)snd_pcm_info_get_name();
              pbVar5 = local_58;
              bVar28 = *pbVar12;
              bVar27 = *local_58;
              bVar24 = bVar28;
              pbVar25 = local_58;
              while (bVar27 != 0) {
                pbVar26 = pbVar12;
                bVar28 = bVar24;
                bVar27 = bVar24;
                if (bVar24 == 0) {
                  bVar24 = 0;
                  bVar28 = 0;
                }
                else {
                  do {
                    pbVar26 = pbVar26 + 1;
                    if (bVar27 != *pbVar25) break;
                    bVar27 = *pbVar26;
                    if ((bVar27 & 0xdf) == 0) {
                      pbVar12 = pbVar26;
                      bVar28 = bVar27;
                      bVar24 = bVar27;
                    }
                    pbVar25 = pbVar25 + 1;
                  } while (bVar27 != 0);
                }
                do {
                  bVar27 = *pbVar25;
                  if (bVar27 == 0) goto LAB_0010e42b;
                  pbVar25 = pbVar25 + 1;
                } while (bVar27 != 0x20);
                bVar27 = *pbVar25;
              }
LAB_0010e42b:
              pbVar25 = (byte *)"-";
              if (bVar28 != 0) {
                while (bVar28 == 0x20) {
                  pbVar25 = pbVar12 + 1;
                  pbVar12 = pbVar12 + 1;
                  bVar28 = *pbVar25;
                }
                if ((bVar28 == 0x2d) || (pbVar25 = pbVar12, bVar28 == 0x3a)) {
                  pbVar25 = pbVar12 + (ulong)(pbVar12[1] == 0x20) * 2;
                }
              }
              topNode = (snd_config_t *)CONCAT44(topNode._4_4_,uVar7);
              pcVar9[-8] = -0x7a;
              pcVar9[-7] = -0x1c;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              iVar6 = snprintf((char *)0x0,0,"%s: %s (%s)",pbVar5,pbVar25,&local_e8);
              pPVar2 = local_60->allocations;
              pcVar9[-8] = -0x5f;
              pcVar9[-7] = -0x1c;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              pcVar13 = (char *)PaUtil_GroupAllocateMemory(pPVar2,(long)(iVar6 + 1));
              pbVar12 = local_58;
              if (pcVar13 == (char *)0x0) {
                pcVar30 = 
                "Expression \'deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1327\n"
                ;
                goto LAB_0010e9e8;
              }
              pcVar9[-8] = -0x35;
              pcVar9[-7] = -0x1c;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              snprintf(pcVar13,(long)(iVar6 + 1),"%s: %s (%s)",pbVar12,pbVar25,&local_e8);
              pHVar18 = _devIdx;
              pcVar4 = local_78;
              pcVar30 = pcVar11 + 1;
              if ((_devIdx == (HwDevInfo *)0x0) || (local_78 < pcVar30)) {
                sVar10 = (long)local_78 << 6;
                pcVar9[-8] = -0xc;
                pcVar9[-7] = -0x1c;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                pHVar18 = (HwDevInfo *)realloc(pHVar18,sVar10);
                if (pHVar18 == (HwDevInfo *)0x0) {
                  pcVar30 = 
                  "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1335\n"
                  ;
                  goto LAB_0010e9e8;
                }
                local_78 = (char *)((long)pcVar4 * 2);
                _devIdx = pHVar18;
              }
              alsaApi = local_60;
              pPVar1 = (PaAlsaHostApiRepresentation *)local_60->allocations;
              pcVar9[-8] = ')';
              pcVar9[-7] = -0x1b;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              paUtilErr_ = PaAlsa_StrDup(pPVar1,&local_a8,(char *)&local_e8);
              if (paUtilErr_ < 0) {
                pcVar30 = 
                "Expression \'PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1338\n"
                ;
                goto LAB_0010e9d2;
              }
              _devIdx[(long)pcVar11].alsaName = local_a8;
              _devIdx[(long)pcVar11].name = pcVar13;
              _devIdx[(long)pcVar11].isPlug = local_7c;
              _devIdx[(long)pcVar11].hasPlayback = -(uint)(-1 < (int)cardName) >> 0x1f;
              _devIdx[(long)pcVar11].hasCapture = -(uint)(-1 < (int)topNode) >> 0x1f;
              pcVar13 = alsaDeviceName;
            }
            uVar3 = local_48;
            pcVar9[-8] = -0x69;
            pcVar9[-7] = -0x1b;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            iVar6 = snd_ctl_pcm_next_device(uVar3,(long)&ctl + 4);
          } while ((iVar6 == 0) && (pcVar11 = pcVar30, -1 < ctl._4_4_));
        }
        uVar3 = local_48;
        pcVar9[-8] = -0x4f;
        pcVar9[-7] = -0x1b;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        snd_ctl_close(uVar3);
      }
      pcVar9[-8] = -0x46;
      pcVar9[-7] = -0x1b;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      iVar6 = snd_card_next(&local_80);
    } while ((iVar6 == 0) && (-1 < local_80));
  }
  if (_snd_config == 0) {
    pcVar9[-8] = -0x1a;
    pcVar9[-7] = -0x1b;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    iVar6 = snd_config_update();
    if (iVar6 < 0) {
      pcVar9[-8] = -0x58;
      pcVar9[-7] = -0x16;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      BuildDeviceList_cold_4();
      return -9999;
    }
    if (_snd_config == 0) {
      *(code **)(pcVar9 + -8) = CloseStream;
      __assert_fail("*alsa_snd_config",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0x54c,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *)");
    }
  }
  pcVar9[-8] = '\r';
  pcVar9[-7] = -0x1a;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  iVar6 = snd_config_search(_snd_config,"pcm",&local_90);
  uVar3 = local_90;
  pcVar13 = pcVar30;
  if (-1 < iVar6) {
    pcVar9[-8] = '!';
    pcVar9[-7] = -0x1a;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    psVar14 = (snd_config_t *)snd_config_iterator_first(uVar3);
    pcVar9[-8] = ',';
    pcVar9[-7] = -0x1a;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    psVar15 = (snd_config_t *)snd_config_iterator_next(psVar14);
    uVar3 = local_90;
    pcVar9[-8] = ';';
    pcVar9[-7] = -0x1a;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    psVar16 = (snd_config_t *)snd_config_iterator_end(uVar3);
    if (psVar14 != psVar16) {
      do {
        local_e8 = "unknown";
        local_58 = (byte *)0x0;
        topNode = psVar15;
        pcVar9[-8] = 'l';
        pcVar9[-7] = -0x1a;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        uVar17 = snd_config_iterator_entry(psVar14);
        local_48 = 0;
        pcVar9[-8] = -0x7a;
        pcVar9[-7] = -0x1a;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        iVar6 = snd_config_search(uVar17,"type",&local_48);
        uVar3 = local_48;
        if (iVar6 < 0) {
          if (iVar6 == -2) goto LAB_0010e6af;
          pcVar30 = 
          "Expression \'err\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1374\n"
          ;
          pcVar9[-8] = '\a';
          pcVar9[-7] = -0x16;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          BuildDeviceList_cold_3();
          uVar20 = extraout_RAX;
LAB_0010ea3c:
          PVar21 = -9999;
          if ((uVar20 & 1) == 0) {
            pcVar9[-8] = 'J';
            pcVar9[-7] = -0x16;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            pcVar13 = (char *)snd_strerror(iVar6);
            pcVar9[-8] = 'Z';
            pcVar9[-7] = -0x16;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar6,pcVar13);
            PVar21 = -9999;
          }
LAB_0010ea7a:
          pcVar9[-8] = -0x7c;
          pcVar9[-7] = -0x16;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          PaUtil_DebugPrint(pcVar30);
          return PVar21;
        }
        pcVar9[-8] = -0x66;
        pcVar9[-7] = -0x1a;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        iVar6 = snd_config_get_string(uVar3,&local_e8);
        if (iVar6 < 0) {
          pcVar30 = 
          "Expression \'alsa_snd_config_get_string( tp, &tpStr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1379\n"
          ;
          pcVar9[-8] = '<';
          pcVar9[-7] = -0x16;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          BuildDeviceList_cold_1();
          uVar20 = extraout_RAX_01;
          goto LAB_0010ea3c;
        }
LAB_0010e6af:
        pcVar9[-8] = -0x45;
        pcVar9[-7] = -0x1a;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        iVar6 = snd_config_get_id(uVar17,&local_58);
        pbVar12 = local_58;
        if (iVar6 < 0) {
          pcVar30 = 
          "Expression \'alsa_snd_config_get_id( n, &idStr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1381\n"
          ;
          pcVar9[-8] = '\x1d';
          pcVar9[-7] = -0x16;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          BuildDeviceList_cold_2();
          uVar20 = extraout_RAX_00;
          goto LAB_0010ea3c;
        }
        lVar29 = 0;
        do {
          pcVar13 = *(char **)((long)&IgnorePlugin_ignoredPlugins + lVar29);
          pcVar9[-8] = -0x2a;
          pcVar9[-7] = -0x1a;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          iVar6 = strcmp((char *)pbVar12,pcVar13);
          psVar14 = topNode;
          if (iVar6 == 0) goto LAB_0010e84d;
          lVar29 = lVar29 + 8;
        } while (lVar29 != 0x50);
        pPVar2 = alsaApi->allocations;
        local_70 = pcVar30;
        pcVar9[-8] = -5;
        pcVar9[-7] = -0x1a;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        sVar10 = strlen((char *)pbVar12);
        pcVar9[-8] = '\a';
        pcVar9[-7] = -0x19;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        pcVar30 = (char *)PaUtil_GroupAllocateMemory(pPVar2,sVar10 + 6);
        pbVar12 = local_58;
        PVar21 = -0x2708;
        if (pcVar30 == (char *)0x0) {
          pcVar30 = 
          "Expression \'alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 6 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1390\n"
          ;
          goto LAB_0010ea7a;
        }
        pcVar9[-8] = '$';
        pcVar9[-7] = -0x19;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        strcpy(pcVar30,(char *)pbVar12);
        pbVar12 = local_58;
        pPVar2 = alsaApi->allocations;
        pcVar9[-8] = '4';
        pcVar9[-7] = -0x19;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        sVar10 = strlen((char *)pbVar12);
        pcVar9[-8] = '@';
        pcVar9[-7] = -0x19;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        pcVar13 = (char *)PaUtil_GroupAllocateMemory(pPVar2,sVar10 + 1);
        pbVar12 = local_58;
        if (pcVar13 == (char *)0x0) {
          pcVar30 = 
          "Expression \'deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 1 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1393\n"
          ;
          goto LAB_0010ea7a;
        }
        pcVar9[-8] = 'X';
        pcVar9[-7] = -0x19;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        strcpy(pcVar13,(char *)pbVar12);
        pHVar18 = _devIdx;
        pcVar11 = local_78;
        cardName = local_70 + 1;
        if ((_devIdx == (HwDevInfo *)0x0) || (local_78 < cardName)) {
          sVar10 = (long)local_78 << 6;
          pcVar9[-8] = -0x7f;
          pcVar9[-7] = -0x19;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          pHVar18 = (HwDevInfo *)realloc(pHVar18,sVar10);
          if (pHVar18 == (HwDevInfo *)0x0) {
            pcVar30 = 
            "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1401\n"
            ;
            goto LAB_0010ea7a;
          }
          local_78 = (char *)((long)pcVar11 * 2);
          _devIdx = pHVar18;
        }
        psVar14 = topNode;
        if (predefinedNames[0].alsaName == (char *)0x0) {
LAB_0010e811:
          _devIdx[(long)local_70].alsaName = pcVar30;
          _devIdx[(long)local_70].name = pcVar13;
          _devIdx[(long)local_70].isPlug = 1;
          _devIdx[(long)local_70].hasPlayback = 1;
          iVar6 = 1;
        }
        else {
          pcVar9[-8] = -0x50;
          pcVar9[-7] = -0x19;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          iVar6 = strcmp(pcVar30,predefinedNames[0].alsaName);
          pHVar18 = predefinedNames;
          if (iVar6 != 0) {
            pHVar18 = predefinedNames;
            do {
              pcVar11 = pHVar18[1].alsaName;
              if (pcVar11 == (char *)0x0) goto LAB_0010e811;
              pcVar9[-8] = -0x2d;
              pcVar9[-7] = -0x19;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              iVar6 = strcmp(pcVar30,pcVar11);
              pHVar18 = pHVar18 + 1;
            } while (iVar6 != 0);
          }
          _devIdx[(long)local_70].alsaName = pcVar30;
          _devIdx[(long)local_70].name = pcVar13;
          _devIdx[(long)local_70].isPlug = 1;
          _devIdx[(long)local_70].hasPlayback = pHVar18->hasPlayback;
          iVar6 = pHVar18->hasCapture;
        }
        _devIdx[(long)local_70].hasCapture = iVar6;
        alsaApi = local_60;
        pcVar30 = cardName;
LAB_0010e84d:
        cardName = pcVar30;
        pcVar30 = cardName;
        pcVar9[-8] = 'U';
        pcVar9[-7] = -0x18;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        psVar15 = (snd_config_t *)snd_config_iterator_next(psVar14);
        uVar3 = local_90;
        pcVar9[-8] = 'd';
        pcVar9[-7] = -0x18;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        psVar16 = (snd_config_t *)snd_config_iterator_end(uVar3);
        pcVar13 = cardName;
      } while (psVar14 != psVar16);
    }
  }
  cardName = pcVar13;
  pcVar30 = cardName;
  pPVar2 = alsaApi->allocations;
  lVar29 = (long)cardName * 8;
  pcVar9[-8] = -0x75;
  pcVar9[-7] = -0x18;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  ppPVar19 = (PaDeviceInfo **)PaUtil_GroupAllocateMemory(pPVar2,lVar29);
  (alsaApi->baseHostApiRep).deviceInfos = ppPVar19;
  if (ppPVar19 == (PaDeviceInfo **)0x0) {
    pcVar30 = 
    "Expression \'baseApi->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1427\n"
    ;
  }
  else {
    pPVar2 = alsaApi->allocations;
    pcVar9[-8] = -0x51;
    pcVar9[-7] = -0x18;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    devInfo = (PaAlsaDeviceInfo *)PaUtil_GroupAllocateMemory(pPVar2,(long)pcVar30 * 0x60);
    if (devInfo != (PaAlsaDeviceInfo *)0x0) {
      ctl._0_4_ = 0;
      devInfo_00 = devInfo;
      pHVar18 = _devIdx;
      if (pcVar30 == (char *)0x0) {
        pcVar13 = (char *)0x0;
      }
      else {
        do {
          pcVar13 = pHVar18->name;
          pcVar9[-8] = -0x1f;
          pcVar9[-7] = -0x18;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          iVar6 = strcmp(pcVar13,"dmix");
          if (iVar6 != 0) {
            pcVar9[-8] = -0xc;
            pcVar9[-7] = -0x18;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            iVar6 = strcmp(pcVar13,"default");
            pPVar1 = local_60;
            uVar7 = local_64;
            if (iVar6 != 0) {
              pcVar9[-8] = '\x0e';
              pcVar9[-7] = -0x17;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              FillInDevInfo(pPVar1,pHVar18,uVar7,devInfo_00,(int *)&ctl);
              paUtilErr_ = 0;
            }
          }
          pcVar30 = pcVar30 + -1;
          devInfo_00 = devInfo_00 + 1;
          pHVar18 = pHVar18 + 1;
        } while (pcVar30 != (char *)0x0);
        pcVar13 = (char *)(long)(int)ctl;
        pcVar30 = cardName;
      }
      pHVar18 = _devIdx;
      if (pcVar30 <= pcVar13) {
        pcVar9[-8] = -0x2f;
        pcVar9[-7] = -0x16;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        __assert_fail("devIdx < numDeviceNames",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x5ad,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *)");
      }
      do {
        pcVar13 = pHVar18->name;
        pcVar9[-8] = 'X';
        pcVar9[-7] = -0x17;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        iVar6 = strcmp(pcVar13,"dmix");
        if (iVar6 == 0) {
LAB_0010e96f:
          pPVar1 = local_60;
          uVar7 = local_64;
          pcVar9[-8] = -0x7b;
          pcVar9[-7] = -0x17;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          FillInDevInfo(pPVar1,pHVar18,uVar7,devInfo,(int *)&ctl);
          paUtilErr_ = 0;
        }
        else {
          pcVar9[-8] = 'k';
          pcVar9[-7] = -0x17;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          iVar6 = strcmp(pcVar13,"default");
          if (iVar6 == 0) goto LAB_0010e96f;
        }
        __ptr = _devIdx;
        devInfo = devInfo + 1;
        pcVar30 = pcVar30 + -1;
        pHVar18 = pHVar18 + 1;
        if (pcVar30 == (char *)0x0) {
          pcVar9[-8] = -0x5b;
          pcVar9[-7] = -0x17;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          free(__ptr);
          (local_60->baseHostApiRep).info.deviceCount = (int)ctl;
          return 0;
        }
      } while( true );
    }
    pcVar30 = 
    "Expression \'deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1431\n"
    ;
  }
LAB_0010e9e8:
  pcVar9[-8] = -0x11;
  pcVar9[-7] = -0x17;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  PaUtil_DebugPrint(pcVar30);
  return -0x2708;
}

Assistant:

static PaError BuildDeviceList( PaAlsaHostApiRepresentation *alsaApi )
{
    PaUtilHostApiRepresentation *baseApi = &alsaApi->baseHostApiRep;
    PaAlsaDeviceInfo *deviceInfoArray;
    int cardIdx = -1, devIdx = 0;
    snd_ctl_card_info_t *cardInfo;
    PaError result = paNoError;
    size_t numDeviceNames = 0, maxDeviceNames = 1, i;
    HwDevInfo *hwDevInfos = NULL;
    snd_config_t *topNode = NULL;
    snd_pcm_info_t *pcmInfo;
    int res;
    int blocking = SND_PCM_NONBLOCK;
    int usePlughw = 0;
    char *hwPrefix = "";
    char alsaCardName[50];
#ifdef PA_ENABLE_DEBUG_OUTPUT
    PaTime startTime = PaUtil_GetTime();
#endif

    if( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) && atoi( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) ) )
        blocking = 0;

    /* If PA_ALSA_PLUGHW is 1 (non-zero), use the plughw: pcm throughout instead of hw: */
    if( getenv( "PA_ALSA_PLUGHW" ) && atoi( getenv( "PA_ALSA_PLUGHW" ) ) )
    {
        usePlughw = 1;
        hwPrefix = "plug";
        PA_DEBUG(( "%s: Using Plughw\n", __FUNCTION__ ));
    }

    /* These two will be set to the first working input and output device, respectively */
    baseApi->info.defaultInputDevice = paNoDevice;
    baseApi->info.defaultOutputDevice = paNoDevice;

    /* Gather info about hw devices

     * alsa_snd_card_next() modifies the integer passed to it to be:
     *      the index of the first card if the parameter is -1
     *      the index of the next card if the parameter is the index of a card
     *      -1 if there are no more cards
     *
     * The function itself returns 0 if it succeeded. */
    cardIdx = -1;
    alsa_snd_ctl_card_info_alloca( &cardInfo );
    alsa_snd_pcm_info_alloca( &pcmInfo );
    while( alsa_snd_card_next( &cardIdx ) == 0 && cardIdx >= 0 )
    {
        char *cardName;
        int devIdx = -1;
        snd_ctl_t *ctl;
        char buf[50];

        snprintf( alsaCardName, sizeof (alsaCardName), "hw:%d", cardIdx );

        /* Acquire name of card */
        if( alsa_snd_ctl_open( &ctl, alsaCardName, 0 ) < 0 )
        {
            /* Unable to open card :( */
            PA_DEBUG(( "%s: Unable to open device %s\n", __FUNCTION__, alsaCardName ));
            continue;
        }
        alsa_snd_ctl_card_info( ctl, cardInfo );

        PA_ENSURE( PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo )) );

        while( alsa_snd_ctl_pcm_next_device( ctl, &devIdx ) == 0 && devIdx >= 0 )
        {
            char *alsaDeviceName, *deviceName, *infoName;
            size_t len;
            int hasPlayback = 0, hasCapture = 0;

            snprintf( buf, sizeof (buf), "%s%s,%d", hwPrefix, alsaCardName, devIdx );

            /* Obtain info about this particular device */
            alsa_snd_pcm_info_set_device( pcmInfo, devIdx );
            alsa_snd_pcm_info_set_subdevice( pcmInfo, 0 );
            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_CAPTURE );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasCapture = 1;
            }

            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_PLAYBACK );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasPlayback = 1;
            }

            if( !hasPlayback && !hasCapture )
            {
                /* Error */
                continue;
            }

            infoName = SkipCardDetailsInName( (char *)alsa_snd_pcm_info_get_name( pcmInfo ), cardName );

            /* The length of the string written by snprintf plus terminating 0 */
            len = snprintf( NULL, 0, "%s: %s (%s)", cardName, infoName, buf ) + 1;
            PA_UNLESS( deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len ),
                    paInsufficientMemory );
            snprintf( deviceName, len, "%s: %s (%s)", cardName, infoName, buf );

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            PA_ENSURE( PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf ) );

            hwDevInfos[ numDeviceNames - 1 ].alsaName = alsaDeviceName;
            hwDevInfos[ numDeviceNames - 1 ].name = deviceName;
            hwDevInfos[ numDeviceNames - 1 ].isPlug = usePlughw;
            hwDevInfos[ numDeviceNames - 1 ].hasPlayback = hasPlayback;
            hwDevInfos[ numDeviceNames - 1 ].hasCapture = hasCapture;
        }
        alsa_snd_ctl_close( ctl );
    }

    /* Iterate over plugin devices */
    if( NULL == (*alsa_snd_config) )
    {
        /* alsa_snd_config_update is called implicitly by some functions, if this hasn't happened snd_config will be NULL (bleh) */
        ENSURE_( alsa_snd_config_update(), paUnanticipatedHostError );
        PA_DEBUG(( "Updating snd_config\n" ));
    }
    assert( *alsa_snd_config );
    if( ( res = alsa_snd_config_search( *alsa_snd_config, "pcm", &topNode ) ) >= 0 )
    {
        snd_config_iterator_t i, next;

        alsa_snd_config_for_each( i, next, topNode )
        {
            const char *tpStr = "unknown", *idStr = NULL;
            int err = 0;

            char *alsaDeviceName, *deviceName;
            const HwDevInfo *predefined = NULL;
            snd_config_t *n = alsa_snd_config_iterator_entry( i ), * tp = NULL;;

            if( (err = alsa_snd_config_search( n, "type", &tp )) < 0 )
            {
                if( -ENOENT != err )
                {
                    ENSURE_(err, paUnanticipatedHostError);
                }
            }
            else
            {
                ENSURE_( alsa_snd_config_get_string( tp, &tpStr ), paUnanticipatedHostError );
            }
            ENSURE_( alsa_snd_config_get_id( n, &idStr ), paUnanticipatedHostError );
            if( IgnorePlugin( idStr ) )
            {
                PA_DEBUG(( "%s: Ignoring ALSA plugin device [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));
                continue;
            }
            PA_DEBUG(( "%s: Found plugin [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));

            PA_UNLESS( alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 6 ), paInsufficientMemory );
            strcpy( alsaDeviceName, idStr );
            PA_UNLESS( deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 1 ), paInsufficientMemory );
            strcpy( deviceName, idStr );

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            predefined = FindDeviceName( alsaDeviceName );

            hwDevInfos[numDeviceNames - 1].alsaName = alsaDeviceName;
            hwDevInfos[numDeviceNames - 1].name     = deviceName;
            hwDevInfos[numDeviceNames - 1].isPlug   = 1;

            if( predefined )
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = predefined->hasPlayback;
                hwDevInfos[numDeviceNames - 1].hasCapture  = predefined->hasCapture;
            }
            else
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = 1;
                hwDevInfos[numDeviceNames - 1].hasCapture  = 1;
            }
        }
    }
    else
        PA_DEBUG(( "%s: Iterating over ALSA plugins failed: %s\n", __FUNCTION__, alsa_snd_strerror( res ) ));

    /* allocate deviceInfo memory based on the number of devices */
    PA_UNLESS( baseApi->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) ), paInsufficientMemory );

    /* allocate all device info structs in a contiguous block */
    PA_UNLESS( deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames ), paInsufficientMemory );

    /* Loop over list of cards, filling in info. If a device is deemed unavailable (can't get name),
     * it's ignored.
     *
     * Note that we do this in two stages. This is a workaround owing to the fact that the 'dmix'
     * plugin may cause the underlying hardware device to be busy for a short while even after it
     * (dmix) is closed. The 'default' plugin may also point to the dmix plugin, so the same goes
     * for this.
     */
    PA_DEBUG(( "%s: Filling device info for %d devices\n", __FUNCTION__, numDeviceNames ));
    for( i = 0, devIdx = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( !strcmp( hwInfo->name, "dmix" ) || !strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx ) );
    }
    assert( devIdx < numDeviceNames );
    /* Now inspect 'dmix' and 'default' plugins */
    for( i = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( strcmp( hwInfo->name, "dmix" ) && strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx ) );
    }
    free( hwDevInfos );

    baseApi->info.deviceCount = devIdx;   /* Number of successfully queried devices */

#ifdef PA_ENABLE_DEBUG_OUTPUT
    PA_DEBUG(( "%s: Building device list took %f seconds\n", __FUNCTION__, PaUtil_GetTime() - startTime ));
#endif

end:
    return result;

error:
    /* No particular action */
    goto end;
}